

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_edge.c
# Opt level: O2

REF_STATUS ref_edge_create(REF_EDGE *ref_edge_ptr,REF_GRID ref_grid)

{
  REF_NODE pRVar1;
  REF_CELL pRVar2;
  uint uVar3;
  REF_EDGE ref_edge;
  REF_CELL *ppRVar4;
  REF_INT *pRVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  char *pcVar9;
  int iVar10;
  long lVar11;
  int iVar12;
  ulong uVar13;
  undefined8 uStackY_60;
  
  ref_edge = (REF_EDGE)malloc(0x20);
  *ref_edge_ptr = ref_edge;
  if (ref_edge == (REF_EDGE)0x0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_edge.c",0x45,
           "ref_edge_create","malloc *ref_edge_ptr of REF_EDGE_STRUCT NULL");
    return 2;
  }
  ref_edge->n = 0;
  ref_edge->max = 0;
  ref_edge->e2n = (REF_INT *)0x0;
  uVar3 = ref_adj_create(&ref_edge->adj);
  if (uVar3 == 0) {
    pRVar1 = ref_grid->node;
    ref_edge->node = pRVar1;
    if (ref_edge->e2n != (REF_INT *)0x0) {
LAB_0010e05d:
      ppRVar4 = ref_grid->cell + 8;
      for (lVar6 = 8; lVar6 != 0x10; lVar6 = lVar6 + 1) {
        pRVar2 = *ppRVar4;
        for (iVar10 = 0; iVar10 < pRVar2->max; iVar10 = iVar10 + 1) {
          if (pRVar2->c2n[(long)pRVar2->size_per * (long)iVar10] != -1) {
            lVar11 = 0;
            while (lVar11 < pRVar2->edge_per) {
              lVar8 = (long)pRVar2->size_per * (long)iVar10;
              uVar3 = ref_edge_uniq(ref_edge,pRVar2->c2n[pRVar2->e2n[lVar11 * 2] + lVar8],
                                    pRVar2->c2n
                                    [(long)(int)lVar8 + (long)pRVar2->e2n[lVar11 * 2 + 1]]);
              lVar11 = lVar11 + 1;
              if (uVar3 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_edge.c"
                       ,0x31,"ref_edge_builder_uniq",(ulong)uVar3,"add uniq");
                goto LAB_0010e173;
              }
            }
          }
        }
        ppRVar4 = ref_grid->cell + lVar6 + 1;
      }
      ppRVar4 = ref_grid->cell + 3;
      lVar6 = 3;
      do {
        if (lVar6 == 8) {
          return 0;
        }
        pRVar2 = *ppRVar4;
        for (iVar10 = 0; iVar10 < pRVar2->max; iVar10 = iVar10 + 1) {
          if (pRVar2->c2n[(long)pRVar2->size_per * (long)iVar10] != -1) {
            lVar11 = 0;
            while (lVar11 < pRVar2->edge_per) {
              lVar8 = (long)pRVar2->size_per * (long)iVar10;
              uVar3 = ref_edge_uniq(ref_edge,pRVar2->c2n[pRVar2->e2n[lVar11 * 2] + lVar8],
                                    pRVar2->c2n
                                    [(long)(int)lVar8 + (long)pRVar2->e2n[lVar11 * 2 + 1]]);
              lVar11 = lVar11 + 1;
              if (uVar3 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_edge.c"
                       ,0x3a,"ref_edge_builder_uniq",(ulong)uVar3,"add uniq");
                goto LAB_0010e173;
              }
            }
          }
        }
        ppRVar4 = ref_grid->cell + lVar6 + 1;
        lVar6 = lVar6 + 1;
      } while( true );
    }
    if ((long)ref_edge->max == 0) {
      iVar10 = pRVar1->n;
      iVar12 = 100;
      if (0xc < iVar10) {
        iVar12 = iVar10 * 8;
      }
      ref_edge->max = iVar12;
      uVar3 = iVar12 * 2;
      pRVar5 = (REF_INT *)malloc((ulong)uVar3 * 4);
      ref_edge->e2n = pRVar5;
      if (pRVar5 != (REF_INT *)0x0) {
        uVar7 = 0;
        uVar13 = (ulong)uVar3;
        if ((int)uVar3 < 1) {
          uVar13 = uVar7;
        }
        for (; uVar13 != uVar7; uVar7 = uVar7 + 1) {
          pRVar5[uVar7] = -1;
        }
        goto LAB_0010e05d;
      }
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_edge.c",0x29,
             "ref_edge_builder_uniq","malloc ref_edge->e2n of REF_INT NULL");
      uVar3 = 2;
    }
    else {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_edge.c",0x25,
             "ref_edge_builder_uniq","should be zero size",0,(long)ref_edge->max);
      uVar3 = 1;
    }
LAB_0010e173:
    pcVar9 = "build edges";
    uStackY_60 = 0x51;
  }
  else {
    pcVar9 = "create adj";
    uStackY_60 = 0x4d;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_edge.c",uStackY_60
         ,"ref_edge_create",(ulong)uVar3,pcVar9);
  return uVar3;
}

Assistant:

REF_FCN REF_STATUS ref_edge_create(REF_EDGE *ref_edge_ptr, REF_GRID ref_grid) {
  REF_EDGE ref_edge;

  ref_malloc(*ref_edge_ptr, 1, REF_EDGE_STRUCT);

  ref_edge = *ref_edge_ptr;

  ref_edge_n(ref_edge) = 0;
  ref_edge_max(ref_edge) = 0;
  ref_edge->e2n = (REF_INT *)NULL;

  RSS(ref_adj_create(&(ref_edge_adj(ref_edge))), "create adj");

  ref_edge_node(ref_edge) = ref_grid_node(ref_grid);

  RSS(ref_edge_builder_uniq(ref_edge, ref_grid), "build edges");

  return REF_SUCCESS;
}